

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::reload(Fl_Shared_Image *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  undefined4 extraout_var;
  Fl_Image *temp;
  Fl_Image *local_70;
  Fl_Image *img;
  uchar header [64];
  FILE *fp;
  int i;
  Fl_Shared_Image *this_local;
  
  if (this->name_ == (char *)0x0) {
    return;
  }
  __stream = (FILE *)fl_fopen(this->name_,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fread(&img,1,0x40,__stream);
  fclose(__stream);
  iVar1 = memcmp(&img,"#define",7);
  if (iVar1 == 0) {
    local_70 = (Fl_Image *)operator_new(0x38);
    Fl_XBM_Image::Fl_XBM_Image((Fl_XBM_Image *)local_70,this->name_);
  }
  else {
    iVar1 = memcmp(&img,"/* XPM */",9);
    if (iVar1 == 0) {
      local_70 = (Fl_Image *)operator_new(0x38);
      Fl_XPM_Image::Fl_XPM_Image((Fl_XPM_Image *)local_70,this->name_);
    }
    else {
      fp._4_4_ = 0;
      local_70 = (Fl_Image *)0x0;
      while ((fp._4_4_ < num_handlers_ &&
             (local_70 = (*handlers_[fp._4_4_])(this->name_,(uchar *)&img,0x40),
             local_70 == (Fl_Image *)0x0))) {
        fp._4_4_ = fp._4_4_ + 1;
      }
    }
  }
  if (local_70 == (Fl_Image *)0x0) {
    return;
  }
  if ((this->alloc_image_ != 0) && (this->image_ != (Fl_Image *)0x0)) {
    (*this->image_->_vptr_Fl_Image[1])();
  }
  this->alloc_image_ = 1;
  iVar1 = Fl_Image::w(local_70);
  iVar2 = Fl_Image::w(&this->super_Fl_Image);
  if ((iVar1 == iVar2) || (iVar1 = Fl_Image::w(&this->super_Fl_Image), iVar1 == 0)) {
    iVar1 = Fl_Image::h(local_70);
    iVar2 = Fl_Image::h(&this->super_Fl_Image);
    if ((iVar1 == iVar2) || (iVar1 = Fl_Image::h(&this->super_Fl_Image), iVar1 == 0)) {
      this->image_ = local_70;
      goto LAB_0020e1cb;
    }
  }
  uVar3 = Fl_Image::w(&this->super_Fl_Image);
  uVar4 = Fl_Image::h(&this->super_Fl_Image);
  iVar1 = (*local_70->_vptr_Fl_Image[2])(local_70,(ulong)uVar3,(ulong)uVar4);
  if (local_70 != (Fl_Image *)0x0) {
    (*local_70->_vptr_Fl_Image[1])();
  }
  this->image_ = (Fl_Image *)CONCAT44(extraout_var,iVar1);
LAB_0020e1cb:
  update(this);
  return;
}

Assistant:

void Fl_Shared_Image::reload() {
  // Load image from disk...
  int		i;		// Looping var
  FILE		*fp;		// File pointer
  uchar		header[64];	// Buffer for auto-detecting files
  Fl_Image	*img;		// New image

  if (!name_) return;

  if ((fp = fl_fopen(name_, "rb")) != NULL) {
    if (fread(header, 1, sizeof(header), fp)==0) { /* ignore */ }
    fclose(fp);
  } else {
    return;
  }

  // Load the image as appropriate...
  if (memcmp(header, "#define", 7) == 0) // XBM file
    img = new Fl_XBM_Image(name_);
  else if (memcmp(header, "/* XPM */", 9) == 0) // XPM file
    img = new Fl_XPM_Image(name_);
  else {
    // Not a standard format; try an image handler...
    for (i = 0, img = 0; i < num_handlers_; i ++) {
      img = (handlers_[i])(name_, header, sizeof(header));

      if (img) break;
    }
  }

  if (img) {
    if (alloc_image_) delete image_;

    alloc_image_ = 1;

    if ((img->w() != w() && w()) || (img->h() != h() && h())) {
      // Make sure the reloaded image is the same size as the existing one.
      Fl_Image *temp = img->copy(w(), h());
      delete img;
      image_ = temp;
    } else {
      image_ = img;
    }

    update();
  }
}